

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O1

bool __thiscall delaunator::compare::operator()(compare *this,size_t i,size_t j)

{
  double dVar1;
  double dVar2;
  pointer pdVar3;
  bool bVar4;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  
  pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar3[i * 2 + 1];
  dVar6 = pdVar3[i * 2] - this->cx;
  dVar7 = dVar1 - this->cy;
  dVar2 = pdVar3[j * 2 + 1];
  dVar9 = pdVar3[j * 2] - this->cx;
  dVar8 = dVar2 - this->cy;
  dVar6 = (dVar6 * dVar6 + dVar7 * dVar7) - (dVar9 * dVar9 + dVar8 * dVar8);
  if (dVar6 == 0.0) {
    dVar6 = pdVar3[i * 2] - pdVar3[j * 2];
    if (dVar6 == 0.0) {
      bVar5 = dVar2 == dVar1;
      bVar4 = dVar2 < dVar1;
    }
    else {
      bVar5 = dVar6 == 0.0;
      bVar4 = 0.0 < dVar6;
    }
  }
  else {
    bVar5 = dVar6 == 0.0;
    bVar4 = 0.0 < dVar6;
  }
  return !bVar4 && !bVar5;
}

Assistant:

bool operator()(std::size_t i, std::size_t j) {
        const double d1 = dist(coords[2 * i], coords[2 * i + 1], cx, cy);
        const double d2 = dist(coords[2 * j], coords[2 * j + 1], cx, cy);
        const double diff1 = d1 - d2;
        const double diff2 = coords[2 * i] - coords[2 * j];
        const double diff3 = coords[2 * i + 1] - coords[2 * j + 1];

        if (diff1 > 0.0 || diff1 < 0.0) {
            return diff1 < 0;
        } else if (diff2 > 0.0 || diff2 < 0.0) {
            return diff2 < 0;
        } else {
            return diff3 < 0;
        }
    }